

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blockers_triangles_iterators.h
# Opt level: O2

bool __thiscall
Gudhi::skeleton_blocker::
Triangle_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
::finished(Triangle_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
           *this)

{
  element_type *peVar1;
  bool bVar2;
  Graph *pGVar3;
  
  bVar2 = true;
  if (this->is_end_ == false) {
    peVar1 = (this->link_).
             super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if ((element_type *)(this->current_edge_).complex == peVar1) {
      pGVar3 = &(peVar1->
                super_Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
                ).
                super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                .skeleton;
      return pGVar3 == (Graph *)(this->current_edge_).edge_iterator.second.
                                super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                                .m_iterator._M_node &&
             (Graph *)(this->current_edge_).edge_iterator.first.
                      super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                      .m_iterator._M_node == pGVar3;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool finished() const {
    return is_end_ || (current_edge_ == link_->edge_range().end());
  }